

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Abc_NtkComputePaths(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  Acb_Ntk_t *p_00;
  Vec_Int_t *pVVar3;
  float *pfVar4;
  size_t __size;
  long lVar5;
  
  p_00 = Acb_NtkFromAbc(p);
  iVar1 = (p_00->vObjType).nCap;
  if ((p_00->vFanouts).nCap < iVar1) {
    pVVar3 = (p_00->vFanouts).pArray;
    __size = (long)iVar1 << 4;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,__size);
    }
    (p_00->vFanouts).pArray = pVVar3;
    lVar5 = (long)(p_00->vFanouts).nCap;
    memset(pVVar3 + lVar5,0,(iVar1 - lVar5) * 0x10);
    (p_00->vFanouts).nCap = iVar1;
  }
  (p_00->vFanouts).nSize = iVar1;
  if (1 < (p_00->vObjType).nSize) {
    lVar5 = 1;
    do {
      if ((p_00->vObjType).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p_00->vObjType).pArray[lVar5] != '\0') {
        Acb_ObjAddFaninFanout(p_00,(int)lVar5);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p_00->vObjType).nSize);
  }
  uVar2 = (p_00->vObjType).nCap;
  if ((p_00->vCounts).nCap < (int)uVar2) {
    pfVar4 = (p_00->vCounts).pArray;
    if (pfVar4 == (float *)0x0) {
      pfVar4 = (float *)malloc((long)(int)uVar2 << 2);
    }
    else {
      pfVar4 = (float *)realloc(pfVar4,(long)(int)uVar2 << 2);
    }
    (p_00->vCounts).pArray = pfVar4;
    (p_00->vCounts).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p_00->vCounts).pArray,0,(ulong)uVar2 * 4);
  }
  (p_00->vCounts).nSize = uVar2;
  uVar2 = Acb_NtkComputePaths(p_00);
  printf("Computed %d paths.\n",(ulong)uVar2);
  Acb_NtkPrintPaths(p_00);
  Acb_ManFree(p_00->pDesign);
  return;
}

Assistant:

void Abc_NtkComputePaths( Abc_Ntk_t * p )
{
    extern Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p );
    Acb_Ntk_t * pNtk = Acb_NtkFromAbc( p );
    Acb_NtkCreateFanout( pNtk );
    Acb_NtkCleanObjCounts( pNtk );
    printf( "Computed %d paths.\n", Acb_NtkComputePaths(pNtk) );
    Acb_NtkPrintPaths( pNtk );
    Acb_ManFree( pNtk->pDesign );
}